

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::AnyMetadata::UnpackTo(AnyMetadata *this,Message *message)

{
  bool bVar1;
  Descriptor *this_00;
  string *in_RSI;
  StringPiece *in_RDI;
  AnyMetadata *in_stack_00000048;
  undefined1 in_stack_00000050 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  bool local_1;
  
  this_00 = Message::GetDescriptor((Message *)in_RDI);
  Descriptor::full_name_abi_cxx11_(this_00);
  StringPiece::StringPiece<std::allocator<char>>(in_RDI,in_stack_ffffffffffffffc8);
  bVar1 = InternalIs(in_stack_00000048,(StringPiece)in_stack_00000050);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ArenaStringPtr::GetNoArena_abi_cxx11_((ArenaStringPtr *)in_RDI->length_);
    local_1 = MessageLite::ParseFromString((MessageLite *)in_RDI,in_RSI);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AnyMetadata::UnpackTo(Message* message) const {
  if (!InternalIs(message->GetDescriptor()->full_name())) {
    return false;
  }
  return message->ParseFromString(value_->GetNoArena());
}